

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

size_t __thiscall helics::Input::getVectorSize(Input *this)

{
  bool bVar1;
  char *pcVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar3;
  int __c;
  char *in_RSI;
  Input *in_RDI;
  vector<double,_std::allocator<double>_> *out;
  vector<double,_std::allocator<double>_> *out_1;
  Input *in_stack_000000c0;
  Input *in_stack_ffffffffffffffc8;
  size_type local_8;
  
  isUpdated(in_stack_ffffffffffffffc8);
  bVar1 = allowDirectFederateUpdate(in_RDI);
  if (bVar1) {
    pvVar3 = getValueRef<std::vector<double,std::allocator<double>>>(in_stack_000000c0);
    local_8 = CLI::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)pvVar3);
  }
  else {
    pcVar2 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index(&in_RDI->lastValue,in_RSI,__c);
    if (pcVar2 == (char *)0x4) {
      pvVar3 = std::
               get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)0x36a604);
      local_8 = CLI::std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)pvVar3);
    }
    else if (pcVar2 == (char *)0x5) {
      this_00 = std::
                get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                            *)0x36a621);
      local_8 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                          ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           this_00);
    }
    else {
      pvVar3 = getValueRef<std::vector<double,std::allocator<double>>>(in_stack_000000c0);
      local_8 = CLI::std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)pvVar3);
    }
  }
  return local_8;
}

Assistant:

size_t Input::getVectorSize()
{
    isUpdated();
    if (allowDirectFederateUpdate()) {
        const auto& out = getValueRef<std::vector<double>>();
        return out.size();
    }
    switch (lastValue.index()) {
        case vector_loc:
            return std::get<std::vector<double>>(lastValue).size();
        case complex_vector_loc:
            return std::get<std::vector<std::complex<double>>>(lastValue).size();
        default:
            break;
    }
    const auto& out = getValueRef<std::vector<double>>();
    return out.size();
}